

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O3

void Nwk_ManIncrementTravId(Nwk_Man_t *pNtk)

{
  void **ppvVar1;
  void *pvVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  iVar3 = pNtk->nTravIds;
  if (0x3fffffe < iVar3) {
    lVar4 = (long)pNtk->vObjs->nSize;
    if (0 < lVar4) {
      ppvVar1 = pNtk->vObjs->pArray;
      lVar5 = 0;
      do {
        pvVar2 = ppvVar1[lVar5];
        if (pvVar2 != (void *)0x0) {
          *(undefined4 *)((long)pvVar2 + 0x28) = 0;
        }
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
    }
    iVar3 = 0;
  }
  pNtk->nTravIds = iVar3 + 1;
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Increments the current traversal ID of the network.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Nwk_ManIncrementTravId( Nwk_Man_t * pNtk )
{
    Nwk_Obj_t * pObj;
    int i;
    if ( pNtk->nTravIds >= (1<<26)-1 )
    {
        pNtk->nTravIds = 0;
        Nwk_ManForEachObj( pNtk, pObj, i )
            pObj->TravId = 0;
    }
    pNtk->nTravIds++;
}